

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

ec_curve * ec_ed25519(void)

{
  mp_int *p_00;
  mp_int *d_00;
  mp_int *a_00;
  mp_int *G_x_00;
  mp_int *G_y_00;
  mp_int *G_order_00;
  mp_int *nonsquare;
  mp_int *nonsquare_mod_p;
  mp_int *G_order;
  mp_int *G_y;
  mp_int *G_x;
  mp_int *a;
  mp_int *d;
  mp_int *p;
  
  if (!ec_ed25519::initialised) {
    p_00 = mp__from_string_literal
                     ("0x7fffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffed");
    d_00 = mp__from_string_literal
                     ("0x52036cee2b6ffe738cc740797779e89800700a4d4141d8ab75eb4dca135978a3");
    a_00 = mp__from_string_literal
                     ("0x7fffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffec");
    G_x_00 = mp__from_string_literal
                       ("0x216936d3cd6e53fec0a4e231fdd6dc5c692cc7609525a7b2c9562d608f25d51a");
    G_y_00 = mp__from_string_literal
                       ("0x6666666666666666666666666666666666666666666666666666666666666658");
    G_order_00 = mp__from_string_literal
                           ("0x1000000000000000000000000000000014def9dea2f79cd65812631a5cf5d3ed");
    nonsquare = mp_from_integer(2);
    initialise_ecurve(&ec_ed25519::curve,p_00,d_00,a_00,nonsquare,G_x_00,G_y_00,G_order_00,3);
    mp_free(p_00);
    mp_free(d_00);
    mp_free(a_00);
    mp_free(G_x_00);
    mp_free(G_y_00);
    mp_free(G_order_00);
    mp_free(nonsquare);
    ec_ed25519::curve.name = (char *)0x0;
    ec_ed25519::curve.textname = "Ed25519";
    ec_ed25519::initialised = true;
  }
  return &ec_ed25519::curve;
}

Assistant:

static struct ec_curve *ec_ed25519(void)
{
    static struct ec_curve curve = { 0 };
    static bool initialised = false;

    if (!initialised)
    {
        mp_int *p = MP_LITERAL(0x7fffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffed);
        mp_int *d = MP_LITERAL(0x52036cee2b6ffe738cc740797779e89800700a4d4141d8ab75eb4dca135978a3);
        mp_int *a = MP_LITERAL(0x7fffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffec); /* == p-1 */
        mp_int *G_x = MP_LITERAL(0x216936d3cd6e53fec0a4e231fdd6dc5c692cc7609525a7b2c9562d608f25d51a);
        mp_int *G_y = MP_LITERAL(0x6666666666666666666666666666666666666666666666666666666666666658);
        mp_int *G_order = MP_LITERAL(0x1000000000000000000000000000000014def9dea2f79cd65812631a5cf5d3ed);
        mp_int *nonsquare_mod_p = mp_from_integer(2);
        initialise_ecurve(&curve, p, d, a, nonsquare_mod_p,
                          G_x, G_y, G_order, 3);
        mp_free(p);
        mp_free(d);
        mp_free(a);
        mp_free(G_x);
        mp_free(G_y);
        mp_free(G_order);
        mp_free(nonsquare_mod_p);

        /* This curve doesn't need a name, because it's never used in
         * any format that embeds the curve name */
        curve.name = NULL;

        curve.textname = "Ed25519";

        /* Now initialised, no need to do it again */
        initialised = true;
    }

    return &curve;
}